

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O3

void crc32(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint8_t *buf;
  
  uVar5 = ~seed;
  uVar6 = len;
  if (7 < len) {
    do {
      uVar6 = uVar5 >> 8 ^ crc_table[(byte)(*key ^ (byte)uVar5)];
      uVar6 = uVar6 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 1) ^ (byte)uVar6)];
      uVar6 = uVar6 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 2) ^ (byte)uVar6)];
      pbVar1 = (byte *)((long)key + 5);
      uVar6 = uVar6 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 3) ^ (byte)uVar6)];
      pbVar2 = (byte *)((long)key + 6);
      uVar6 = uVar6 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 4) ^ (byte)uVar6)];
      pbVar3 = (byte *)((long)key + 7);
      key = (void *)((long)key + 8);
      uVar6 = uVar6 >> 8 ^ crc_table[(byte)(*pbVar1 ^ (byte)uVar6)];
      uVar6 = uVar6 >> 8 ^ crc_table[(byte)(*pbVar2 ^ (byte)uVar6)];
      uVar5 = uVar6 >> 8 ^ crc_table[(byte)(*pbVar3 ^ (byte)uVar6)];
      uVar6 = len - 8;
      bVar4 = 0xf < (uint)len;
      len = uVar6;
    } while (bVar4);
  }
  if (uVar6 != 0) {
    lVar7 = 0;
    do {
      pbVar1 = (byte *)((long)key + lVar7);
      lVar7 = lVar7 + 1;
      uVar5 = uVar5 >> 8 ^ crc_table[(byte)(*pbVar1 ^ (byte)uVar5)];
    } while (uVar6 != (uint)lVar7);
  }
  *(uint *)out = ~uVar5;
  return;
}

Assistant:

void crc32 ( const void * key, int len, uint32_t seed, void * out )
{
  uint8_t * buf = (uint8_t*)key;
  uint32_t crc = seed ^ 0xffffffffL;

  while (len >= 8)
  {
    DO8(buf);
    len -= 8;
  }

  while(len--)
  {
    DO1(buf);
  } 

  crc ^= 0xffffffffL;

  *(uint32_t*)out = crc;
}